

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O0

shared_ptr<gui::ChatBox> __thiscall
EditorInterface::debugWidgetCreation<gui::ChatBox>
          (EditorInterface *this,shared_ptr<gui::ChatBox> *widget)

{
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt;
  bool bVar1;
  level_enum lVar2;
  element_type *peVar3;
  shared_ptr<gui::ChatBox> *this_00;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<gui::ChatBox> sVar5;
  iterator foundWidget;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
  *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  shared_ptr<gui::ChatBox> *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  byte local_e1;
  String *this_01;
  element_type *this_02;
  string local_a8 [48];
  basic_string_view<char> local_78;
  _Self local_68 [3];
  String local_50;
  _Self local_30 [4];
  char *local_10;
  basic_string_view<char> *local_8;
  
  this_02 = in_RDI;
  lVar2 = spdlog::get_level();
  if ((int)lVar2 < 2) {
    peVar3 = std::__shared_ptr_access<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9b64);
    ::gui::Widget::getName(&peVar3->super_Widget);
    this_01 = &local_50;
    sf::String::operator_cast_to_string(this_01);
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
         ::find(in_stack_fffffffffffffef8,(key_type *)0x1b9b90);
    std::__cxx11::string::~string((string *)&local_50);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
         ::end(in_stack_fffffffffffffef8);
    bVar1 = std::operator!=(local_30,local_68);
    local_e1 = 0;
    if (bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
                    *)0x1b9bf8);
      bVar1 = std::__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>::expired
                        ((__weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *)0x1b9c04);
      local_e1 = bVar1 ^ 0xff;
    }
    if ((local_e1 & 1) != 0) {
      local_8 = &local_78;
      local_10 = "Created widget with name \"{}\" which already exists.";
      ::fmt::v11::basic_string_view<char>::basic_string_view
                (local_8,"Created widget with name \"{}\" which already exists.",0x33);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>
                    *)0x1b9c5d);
      fmt.str.size_ = in_stack_ffffffffffffff10;
      fmt.str.data_ = (char *)in_stack_ffffffffffffff08;
      spdlog::warn<std::__cxx11::string_const&>(fmt,in_stack_ffffffffffffff00);
    }
    std::dynamic_pointer_cast<gui::Widget,gui::ChatBox>(in_stack_ffffffffffffff08);
    peVar3 = std::__shared_ptr_access<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9cc7);
    ::gui::Widget::getName(&peVar3->super_Widget);
    sf::String::operator_cast_to_string(this_01);
    this_00 = (shared_ptr<gui::ChatBox> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<gui::Widget>_>_>_>
                            *)this_02,in_RDX);
    std::weak_ptr<gui::Widget>::operator=
              ((weak_ptr<gui::Widget> *)this_00,(shared_ptr<gui::Widget> *)in_stack_fffffffffffffef8
              );
    std::__cxx11::string::~string(local_a8);
    std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x1b9d26);
    std::shared_ptr<gui::ChatBox>::shared_ptr
              (this_00,(shared_ptr<gui::ChatBox> *)in_stack_fffffffffffffef8);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<gui::ChatBox>::shared_ptr
              ((shared_ptr<gui::ChatBox> *)in_stack_ffffffffffffff00,
               (shared_ptr<gui::ChatBox> *)in_stack_fffffffffffffef8);
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar5.super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::ChatBox>)
         sVar5.super___shared_ptr<gui::ChatBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> EditorInterface::debugWidgetCreation(std::shared_ptr<T> widget) const {
    if (spdlog::get_level() > spdlog::level::debug) {    // FIXME: probably not ideal to check this way. check the cmake build type instead? if so, then set spdlog::level with that too.
        return widget;
    }

    const auto foundWidget = debugWidgets_.find(widget->getName());
    if (foundWidget != debugWidgets_.end() && !foundWidget->second.expired()) {
        spdlog::warn("Created widget with name \"{}\" which already exists.", foundWidget->first);
    }

    debugWidgets_[widget->getName()] = std::dynamic_pointer_cast<gui::Widget>(widget);
    return widget;
}